

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

void ClusterBlocksDistance
               (MemoryManager *m,uint16_t *data,size_t length,size_t num_blocks,uint8_t *block_ids,
               BlockSplit *split)

{
  HistogramDistance *__s;
  size_t sVar1;
  double dVar2;
  byte local_f3c;
  uint32_t *local_f38;
  uint32_t *local_f30;
  uint8_t *local_f28;
  uint8_t *local_f20;
  uint local_f14;
  void *local_f10;
  uint32_t *local_f08;
  void *local_f00;
  size_t local_ef8;
  void *local_ef0;
  uint32_t *local_ee8;
  void *local_ee0;
  HistogramDistance *local_ed8;
  ulong local_ed0;
  HistogramDistance *local_ec0;
  size_t local_eb8;
  size_t local_ea8;
  void *local_ea0;
  void *local_e98;
  void *local_e90;
  uint32_t *local_e88;
  byte local_e79;
  uint8_t id;
  size_t sStack_e78;
  uint8_t max_type;
  size_t block_idx_1;
  uint32_t cur_length;
  uint32_t *new_array_3;
  size_t _new_size_3;
  uint8_t *new_array_2;
  size_t _new_size_2;
  double cur_bits;
  double best_bits;
  ulong uStack_e30;
  uint32_t best_out;
  size_t j_1;
  HistogramDistance histo;
  uint32_t next_index;
  uint32_t *new_array_1;
  size_t _new_size_1;
  HistogramDistance *new_array;
  size_t _new_size;
  size_t k;
  size_t j;
  size_t num_new_clusters;
  size_t num_to_combine;
  size_t block_idx;
  uint32_t remap [64];
  uint32_t symbols [64];
  uint32_t new_clusters [64];
  uint32_t sizes [64];
  size_t i;
  uint32_t *new_index;
  size_t num_final_clusters;
  uint32_t *clusters;
  size_t pos;
  HistogramPair *pairs;
  size_t pairs_capacity;
  size_t max_num_pairs;
  HistogramDistance *histograms;
  size_t num_clusters;
  uint32_t *cluster_size;
  size_t cluster_size_capacity;
  size_t cluster_size_size;
  HistogramDistance *all_histograms;
  size_t all_histograms_capacity;
  size_t all_histograms_size;
  size_t expected_num_clusters;
  uint32_t *block_lengths;
  uint32_t *histogram_symbols;
  BlockSplit *split_local;
  uint8_t *block_ids_local;
  size_t num_blocks_local;
  size_t length_local;
  uint16_t *data_local;
  MemoryManager *m_local;
  
  if (num_blocks == 0) {
    local_e88 = (uint32_t *)0x0;
    local_e90 = (void *)0x0;
  }
  else {
    local_e88 = (uint32_t *)BrotliAllocate(m,num_blocks << 2);
    local_e90 = BrotliAllocate(m,num_blocks << 2);
  }
  cluster_size = (uint32_t *)((num_blocks + 0x3f) * 0x10 >> 6);
  all_histograms_capacity = 0;
  if ((HistogramDistance *)cluster_size == (HistogramDistance *)0x0) {
    local_e98 = (void *)0x0;
  }
  else {
    local_e98 = BrotliAllocate(m,(long)cluster_size * 0x890);
  }
  cluster_size_size = (size_t)local_e98;
  cluster_size_capacity = 0;
  if ((HistogramDistance *)cluster_size == (HistogramDistance *)0x0) {
    local_ea0 = (void *)0x0;
  }
  else {
    local_ea0 = BrotliAllocate(m,(long)cluster_size << 2);
  }
  num_clusters = (size_t)local_ea0;
  histograms = (HistogramDistance *)0x0;
  local_ea8 = num_blocks;
  if (0x3f < num_blocks) {
    local_ea8 = 0x40;
  }
  if (local_ea8 == 0) {
    local_ec0 = (HistogramDistance *)0x0;
  }
  else {
    local_eb8 = num_blocks;
    if (0x3f < num_blocks) {
      local_eb8 = 0x40;
    }
    local_ec0 = (HistogramDistance *)BrotliAllocate(m,local_eb8 * 0x890);
  }
  pos = (size_t)BrotliAllocate(m,0xc018);
  clusters = (uint32_t *)0x0;
  memset(new_clusters + 0x3e,0,0x100);
  memset(symbols + 0x3e,0,0x100);
  memset(remap + 0x3e,0,0x100);
  memset(&block_idx,0,0x100);
  memset(local_e90,0,num_blocks << 2);
  num_to_combine = 0;
  sizes[0x3e] = 0;
  sizes[0x3f] = 0;
  for (; (ulong)sizes._248_8_ < length; sizes._248_8_ = sizes._248_8_ + 1) {
    *(int *)((long)local_e90 + num_to_combine * 4) =
         *(int *)((long)local_e90 + num_to_combine * 4) + 1;
    if ((sizes._248_8_ + 1 == length) || (block_ids[sizes._248_8_] != block_ids[sizes._248_8_ + 1]))
    {
      num_to_combine = num_to_combine + 1;
    }
  }
  sizes[0x3e] = 0;
  sizes[0x3f] = 0;
  all_histograms = (HistogramDistance *)cluster_size;
  for (; (ulong)sizes._248_8_ < num_blocks; sizes._248_8_ = sizes._248_8_ + 0x40) {
    local_ed0 = num_blocks - sizes._248_8_;
    if (0x3f < local_ed0) {
      local_ed0 = 0x40;
    }
    for (k = 0; k < local_ed0; k = k + 1) {
      __s = local_ec0 + k;
      memset(__s,0,0x880);
      __s->total_count_ = 0;
      __s->bit_cost_ = INFINITY;
      for (_new_size = 0; _new_size < *(uint *)((long)local_e90 + (sizes._248_8_ + k) * 4);
          _new_size = _new_size + 1) {
        local_ec0[k].data_[data[(long)clusters]] = local_ec0[k].data_[data[(long)clusters]] + 1;
        local_ec0[k].total_count_ = local_ec0[k].total_count_ + 1;
        clusters = (uint32_t *)((long)clusters + 1);
      }
      dVar2 = BrotliPopulationCostDistance(local_ec0 + k);
      local_ec0[k].bit_cost_ = dVar2;
      symbols[k + 0x3e] = (uint32_t)k;
      remap[k + 0x3e] = (uint32_t)k;
      new_clusters[k + 0x3e] = 1;
    }
    sVar1 = BrotliHistogramCombineDistance
                      (local_ec0,new_clusters + 0x3e,remap + 0x3e,symbols + 0x3e,
                       (HistogramPair *)pos,local_ed0,local_ed0,0x40,0x800);
    if (all_histograms < (HistogramDistance *)(all_histograms_capacity + sVar1)) {
      if (all_histograms == (HistogramDistance *)0x0) {
        local_ed8 = (HistogramDistance *)(all_histograms_capacity + sVar1);
      }
      else {
        local_ed8 = all_histograms;
      }
      for (new_array = local_ed8; new_array < (HistogramDistance *)(all_histograms_capacity + sVar1)
          ; new_array = (HistogramDistance *)((long)new_array << 1)) {
      }
      if (new_array == (HistogramDistance *)0x0) {
        local_ee0 = (void *)0x0;
      }
      else {
        local_ee0 = BrotliAllocate(m,(long)new_array * 0x890);
      }
      if (all_histograms != (HistogramDistance *)0x0) {
        memcpy(local_ee0,(void *)cluster_size_size,(long)all_histograms * 0x890);
      }
      BrotliFree(m,(void *)cluster_size_size);
      cluster_size_size = (size_t)local_ee0;
      all_histograms = new_array;
    }
    if (cluster_size < (uint32_t *)(cluster_size_capacity + sVar1)) {
      if (cluster_size == (uint32_t *)0x0) {
        local_ee8 = (uint32_t *)(cluster_size_capacity + sVar1);
      }
      else {
        local_ee8 = cluster_size;
      }
      for (new_array_1 = local_ee8; new_array_1 < (uint32_t *)(cluster_size_capacity + sVar1);
          new_array_1 = (uint32_t *)((long)new_array_1 << 1)) {
      }
      if (new_array_1 == (uint32_t *)0x0) {
        local_ef0 = (void *)0x0;
      }
      else {
        local_ef0 = BrotliAllocate(m,(long)new_array_1 << 2);
      }
      if (cluster_size != (uint32_t *)0x0) {
        memcpy(local_ef0,(void *)num_clusters,(long)cluster_size << 2);
      }
      BrotliFree(m,(void *)num_clusters);
      num_clusters = (size_t)local_ef0;
      cluster_size = new_array_1;
    }
    for (k = 0; k < sVar1; k = k + 1) {
      memcpy((void *)(cluster_size_size + all_histograms_capacity * 0x890),
             local_ec0 + symbols[k + 0x3e],0x890);
      *(uint32_t *)(num_clusters + cluster_size_capacity * 4) =
           new_clusters[(ulong)symbols[k + 0x3e] + 0x3e];
      remap[(ulong)symbols[k + 0x3e] - 2] = (uint32_t)k;
      cluster_size_capacity = cluster_size_capacity + 1;
      all_histograms_capacity = all_histograms_capacity + 1;
    }
    for (k = 0; k < local_ed0; k = k + 1) {
      local_e88[sizes._248_8_ + k] = (int)histograms + remap[(ulong)remap[k + 0x3e] - 2];
    }
    histograms = (HistogramDistance *)((long)histograms->data_ + sVar1);
  }
  BrotliFree(m,local_ec0);
  local_ef8 = ((ulong)histograms >> 1) * (long)histograms;
  if ((ulong)((long)histograms << 6) < local_ef8) {
    local_ef8 = (long)histograms << 6;
  }
  if (0x801 < local_ef8 + 1) {
    BrotliFree(m,(void *)pos);
    if (local_ef8 == 0xffffffffffffffff) {
      local_f00 = (void *)0x0;
    }
    else {
      local_f00 = BrotliAllocate(m,(local_ef8 + 1) * 0x18);
    }
    pos = (size_t)local_f00;
  }
  if (histograms == (HistogramDistance *)0x0) {
    local_f08 = (uint32_t *)0x0;
  }
  else {
    local_f08 = (uint32_t *)BrotliAllocate(m,(long)histograms << 2);
  }
  sizes[0x3e] = 0;
  sizes[0x3f] = 0;
  for (; (ulong)sizes._248_8_ < histograms; sizes._248_8_ = sizes._248_8_ + 1) {
    local_f08[sizes._248_8_] = (uint32_t)sizes._248_8_;
  }
  sVar1 = BrotliHistogramCombineDistance
                    ((HistogramDistance *)cluster_size_size,(uint32_t *)num_clusters,local_e88,
                     local_f08,(HistogramPair *)pos,(size_t)histograms,num_blocks,0x100,local_ef8);
  BrotliFree(m,(void *)pos);
  BrotliFree(m,(void *)num_clusters);
  if (histograms == (HistogramDistance *)0x0) {
    local_f10 = (void *)0x0;
  }
  else {
    local_f10 = BrotliAllocate(m,(long)histograms << 2);
  }
  sizes[0x3e] = 0;
  sizes[0x3f] = 0;
  for (; (ulong)sizes._248_8_ < histograms; sizes._248_8_ = sizes._248_8_ + 1) {
    *(undefined4 *)((long)local_f10 + sizes._248_8_ * 4) = 0xffffffff;
  }
  clusters = (uint32_t *)0x0;
  histo.bit_cost_._4_4_ = 0;
  sizes[0x3e] = 0;
  sizes[0x3f] = 0;
  for (; (ulong)sizes._248_8_ < num_blocks; sizes._248_8_ = sizes._248_8_ + 1) {
    memset(&j_1,0,0x880);
    histo.data_[0x21e] = 0;
    histo.data_[0x21f] = 0;
    histo.total_count_ = 0x7ff0000000000000;
    for (uStack_e30 = 0; uStack_e30 < *(uint *)((long)local_e90 + sizes._248_8_ * 4);
        uStack_e30 = uStack_e30 + 1) {
      histo.data_[(ulong)data[(long)clusters] - 2] =
           histo.data_[(ulong)data[(long)clusters] - 2] + 1;
      histo.data_._2168_8_ = histo.data_._2168_8_ + 1;
      clusters = (uint32_t *)((long)clusters + 1);
    }
    if (sizes._248_8_ == 0) {
      local_f14 = *local_e88;
    }
    else {
      local_f14 = local_e88[sizes._248_8_ + -1];
    }
    best_bits._4_4_ = local_f14;
    cur_bits = BrotliHistogramBitCostDistanceDistance
                         ((HistogramDistance *)&j_1,
                          (HistogramDistance *)(cluster_size_size + (ulong)local_f14 * 0x890));
    for (uStack_e30 = 0; uStack_e30 < sVar1; uStack_e30 = uStack_e30 + 1) {
      dVar2 = BrotliHistogramBitCostDistanceDistance
                        ((HistogramDistance *)&j_1,
                         (HistogramDistance *)
                         (cluster_size_size + (ulong)local_f08[uStack_e30] * 0x890));
      if (dVar2 < cur_bits) {
        best_bits._4_4_ = local_f08[uStack_e30];
        cur_bits = dVar2;
      }
    }
    local_e88[sizes._248_8_] = best_bits._4_4_;
    if (*(int *)((long)local_f10 + (ulong)best_bits._4_4_ * 4) == -1) {
      *(int *)((long)local_f10 + (ulong)best_bits._4_4_ * 4) = histo.bit_cost_._4_4_;
      histo.bit_cost_._4_4_ = histo.bit_cost_._4_4_ + 1;
    }
  }
  BrotliFree(m,local_f08);
  BrotliFree(m,(void *)cluster_size_size);
  if (split->types_alloc_size < num_blocks) {
    local_f20 = (uint8_t *)num_blocks;
    if (split->types_alloc_size != 0) {
      local_f20 = (uint8_t *)split->types_alloc_size;
    }
    for (new_array_2 = local_f20; new_array_2 < num_blocks;
        new_array_2 = (uint8_t *)((long)new_array_2 << 1)) {
    }
    if (new_array_2 == (uint8_t *)0x0) {
      local_f28 = (uint8_t *)0x0;
    }
    else {
      local_f28 = (uint8_t *)BrotliAllocate(m,(size_t)new_array_2);
    }
    if (split->types_alloc_size != 0) {
      memcpy(local_f28,split->types,split->types_alloc_size);
    }
    BrotliFree(m,split->types);
    split->types = (uint8_t *)0x0;
    split->types = local_f28;
    split->types_alloc_size = (size_t)new_array_2;
  }
  if (split->lengths_alloc_size < num_blocks) {
    local_f30 = (uint32_t *)num_blocks;
    if (split->lengths_alloc_size != 0) {
      local_f30 = (uint32_t *)split->lengths_alloc_size;
    }
    for (new_array_3 = local_f30; new_array_3 < num_blocks;
        new_array_3 = (uint32_t *)((long)new_array_3 << 1)) {
    }
    if (new_array_3 == (uint32_t *)0x0) {
      local_f38 = (uint32_t *)0x0;
    }
    else {
      local_f38 = (uint32_t *)BrotliAllocate(m,(long)new_array_3 << 2);
    }
    if (split->lengths_alloc_size != 0) {
      memcpy(local_f38,split->lengths,split->lengths_alloc_size << 2);
    }
    BrotliFree(m,split->lengths);
    split->lengths = (uint32_t *)0x0;
    split->lengths = local_f38;
    split->lengths_alloc_size = (size_t)new_array_3;
  }
  block_idx_1._4_4_ = 0;
  sStack_e78 = 0;
  local_e79 = 0;
  sizes[0x3e] = 0;
  sizes[0x3f] = 0;
  for (; (ulong)sizes._248_8_ < num_blocks; sizes._248_8_ = sizes._248_8_ + 1) {
    block_idx_1._4_4_ = *(int *)((long)local_e90 + sizes._248_8_ * 4) + block_idx_1._4_4_;
    if ((sizes._248_8_ + 1 == num_blocks) ||
       (local_e88[sizes._248_8_] != local_e88[sizes._248_8_ + 1])) {
      local_f3c = (byte)*(undefined4 *)((long)local_f10 + (ulong)local_e88[sizes._248_8_] * 4);
      split->types[sStack_e78] = local_f3c;
      split->lengths[sStack_e78] = block_idx_1._4_4_;
      if (local_f3c < local_e79) {
        local_f3c = local_e79;
      }
      local_e79 = local_f3c;
      block_idx_1._4_4_ = 0;
      sStack_e78 = sStack_e78 + 1;
    }
  }
  split->num_blocks = sStack_e78;
  split->num_types = (ulong)local_e79 + 1;
  BrotliFree(m,local_f10);
  BrotliFree(m,local_e90);
  BrotliFree(m,local_e88);
  return;
}

Assistant:

static void FN(ClusterBlocks)(MemoryManager* m,
                              const DataType* data, const size_t length,
                              const size_t num_blocks,
                              uint8_t* block_ids,
                              BlockSplit* split) {
  uint32_t* histogram_symbols = BROTLI_ALLOC(m, uint32_t, num_blocks);
  uint32_t* block_lengths = BROTLI_ALLOC(m, uint32_t, num_blocks);
  const size_t expected_num_clusters = CLUSTERS_PER_BATCH *
      (num_blocks + HISTOGRAMS_PER_BATCH - 1) / HISTOGRAMS_PER_BATCH;
  size_t all_histograms_size = 0;
  size_t all_histograms_capacity = expected_num_clusters;
  HistogramType* all_histograms =
      BROTLI_ALLOC(m, HistogramType, all_histograms_capacity);
  size_t cluster_size_size = 0;
  size_t cluster_size_capacity = expected_num_clusters;
  uint32_t* cluster_size = BROTLI_ALLOC(m, uint32_t, cluster_size_capacity);
  size_t num_clusters = 0;
  HistogramType* histograms = BROTLI_ALLOC(m, HistogramType,
      BROTLI_MIN(size_t, num_blocks, HISTOGRAMS_PER_BATCH));
  size_t max_num_pairs =
      HISTOGRAMS_PER_BATCH * HISTOGRAMS_PER_BATCH / 2;
  size_t pairs_capacity = max_num_pairs + 1;
  HistogramPair* pairs = BROTLI_ALLOC(m, HistogramPair, pairs_capacity);
  size_t pos = 0;
  uint32_t* clusters;
  size_t num_final_clusters;
  static const uint32_t kInvalidIndex = BROTLI_UINT32_MAX;
  uint32_t* new_index;
  size_t i;
  uint32_t sizes[HISTOGRAMS_PER_BATCH] = { 0 };
  uint32_t new_clusters[HISTOGRAMS_PER_BATCH] = { 0 };
  uint32_t symbols[HISTOGRAMS_PER_BATCH] = { 0 };
  uint32_t remap[HISTOGRAMS_PER_BATCH] = { 0 };

  if (BROTLI_IS_OOM(m)) return;

  memset(block_lengths, 0, num_blocks * sizeof(uint32_t));

  {
    size_t block_idx = 0;
    for (i = 0; i < length; ++i) {
      BROTLI_DCHECK(block_idx < num_blocks);
      ++block_lengths[block_idx];
      if (i + 1 == length || block_ids[i] != block_ids[i + 1]) {
        ++block_idx;
      }
    }
    BROTLI_DCHECK(block_idx == num_blocks);
  }

  for (i = 0; i < num_blocks; i += HISTOGRAMS_PER_BATCH) {
    const size_t num_to_combine =
        BROTLI_MIN(size_t, num_blocks - i, HISTOGRAMS_PER_BATCH);
    size_t num_new_clusters;
    size_t j;
    for (j = 0; j < num_to_combine; ++j) {
      size_t k;
      FN(HistogramClear)(&histograms[j]);
      for (k = 0; k < block_lengths[i + j]; ++k) {
        FN(HistogramAdd)(&histograms[j], data[pos++]);
      }
      histograms[j].bit_cost_ = FN(BrotliPopulationCost)(&histograms[j]);
      new_clusters[j] = (uint32_t)j;
      symbols[j] = (uint32_t)j;
      sizes[j] = 1;
    }
    num_new_clusters = FN(BrotliHistogramCombine)(
        histograms, sizes, symbols, new_clusters, pairs, num_to_combine,
        num_to_combine, HISTOGRAMS_PER_BATCH, max_num_pairs);
    BROTLI_ENSURE_CAPACITY(m, HistogramType, all_histograms,
        all_histograms_capacity, all_histograms_size + num_new_clusters);
    BROTLI_ENSURE_CAPACITY(m, uint32_t, cluster_size,
        cluster_size_capacity, cluster_size_size + num_new_clusters);
    if (BROTLI_IS_OOM(m)) return;
    for (j = 0; j < num_new_clusters; ++j) {
      all_histograms[all_histograms_size++] = histograms[new_clusters[j]];
      cluster_size[cluster_size_size++] = sizes[new_clusters[j]];
      remap[new_clusters[j]] = (uint32_t)j;
    }
    for (j = 0; j < num_to_combine; ++j) {
      histogram_symbols[i + j] = (uint32_t)num_clusters + remap[symbols[j]];
    }
    num_clusters += num_new_clusters;
    BROTLI_DCHECK(num_clusters == cluster_size_size);
    BROTLI_DCHECK(num_clusters == all_histograms_size);
  }
  BROTLI_FREE(m, histograms);

  max_num_pairs =
      BROTLI_MIN(size_t, 64 * num_clusters, (num_clusters / 2) * num_clusters);
  if (pairs_capacity < max_num_pairs + 1) {
    BROTLI_FREE(m, pairs);
    pairs = BROTLI_ALLOC(m, HistogramPair, max_num_pairs + 1);
    if (BROTLI_IS_OOM(m)) return;
  }

  clusters = BROTLI_ALLOC(m, uint32_t, num_clusters);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < num_clusters; ++i) {
    clusters[i] = (uint32_t)i;
  }
  num_final_clusters = FN(BrotliHistogramCombine)(
      all_histograms, cluster_size, histogram_symbols, clusters, pairs,
      num_clusters, num_blocks, BROTLI_MAX_NUMBER_OF_BLOCK_TYPES,
      max_num_pairs);
  BROTLI_FREE(m, pairs);
  BROTLI_FREE(m, cluster_size);

  new_index = BROTLI_ALLOC(m, uint32_t, num_clusters);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < num_clusters; ++i) new_index[i] = kInvalidIndex;
  pos = 0;
  {
    uint32_t next_index = 0;
    for (i = 0; i < num_blocks; ++i) {
      HistogramType histo;
      size_t j;
      uint32_t best_out;
      double best_bits;
      FN(HistogramClear)(&histo);
      for (j = 0; j < block_lengths[i]; ++j) {
        FN(HistogramAdd)(&histo, data[pos++]);
      }
      best_out = (i == 0) ? histogram_symbols[0] : histogram_symbols[i - 1];
      best_bits =
          FN(BrotliHistogramBitCostDistance)(&histo, &all_histograms[best_out]);
      for (j = 0; j < num_final_clusters; ++j) {
        const double cur_bits = FN(BrotliHistogramBitCostDistance)(
            &histo, &all_histograms[clusters[j]]);
        if (cur_bits < best_bits) {
          best_bits = cur_bits;
          best_out = clusters[j];
        }
      }
      histogram_symbols[i] = best_out;
      if (new_index[best_out] == kInvalidIndex) {
        new_index[best_out] = next_index++;
      }
    }
  }
  BROTLI_FREE(m, clusters);
  BROTLI_FREE(m, all_histograms);
  BROTLI_ENSURE_CAPACITY(
      m, uint8_t, split->types, split->types_alloc_size, num_blocks);
  BROTLI_ENSURE_CAPACITY(
      m, uint32_t, split->lengths, split->lengths_alloc_size, num_blocks);
  if (BROTLI_IS_OOM(m)) return;
  {
    uint32_t cur_length = 0;
    size_t block_idx = 0;
    uint8_t max_type = 0;
    for (i = 0; i < num_blocks; ++i) {
      cur_length += block_lengths[i];
      if (i + 1 == num_blocks ||
          histogram_symbols[i] != histogram_symbols[i + 1]) {
        const uint8_t id = (uint8_t)new_index[histogram_symbols[i]];
        split->types[block_idx] = id;
        split->lengths[block_idx] = cur_length;
        max_type = BROTLI_MAX(uint8_t, max_type, id);
        cur_length = 0;
        ++block_idx;
      }
    }
    split->num_blocks = block_idx;
    split->num_types = (size_t)max_type + 1;
  }
  BROTLI_FREE(m, new_index);
  BROTLI_FREE(m, block_lengths);
  BROTLI_FREE(m, histogram_symbols);
}